

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

QList<int> * __thiscall
QMap<int,_QWizardPage_*>::keys(QList<int> *__return_storage_ptr__,QMap<int,_QWizardPage_*> *this)

{
  QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
  *pQVar1;
  QList<int> *result;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
                 *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (int *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (int *)0x0;
    (__return_storage_ptr__->d).size = 0;
    QList<int>::reserve(__return_storage_ptr__,
                        (pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    transform<std::_Rb_tree_const_iterator<std::pair<int_const,QWizardPage*>>,std::back_insert_iterator<QList<int>>,QMapData<std::map<int,QWizardPage*,std::less<int>,std::allocator<std::pair<int_const,QWizardPage*>>>>::keys()const::_lambda(auto:1_const&)_1_>
              (*(_Base_ptr *)
                ((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10),
               &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QList<Key> keys() const
    {
        if (!d)
            return {};
        return d->keys();
    }